

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O0

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_arc
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,double x,double y,double dx1,double dy1,
          double dx2,double dy2)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_64;
  int n;
  int i;
  double da;
  double a2;
  double a1;
  double dy2_local;
  double dx2_local;
  double dy1_local;
  double dx1_local;
  double y_local;
  double x_local;
  pod_bvector<agg::point_base<double>,_6U> *vc_local;
  math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this_local;
  
  a2 = atan2(dy1 * (double)this->m_width_sign,dx1 * (double)this->m_width_sign);
  da = atan2(dy2 * (double)this->m_width_sign,dx2 * (double)this->m_width_sign);
  dVar3 = acos(this->m_width_abs / (this->m_width_abs + 0.125 / this->m_approx_scale));
  add_vertex(this,vc,x + dx1,y + dy1);
  if (this->m_width_sign < 1) {
    if (a2 < da) {
      da = da - 6.283185307179586;
    }
    iVar2 = (int)((a2 - da) / (dVar3 * 2.0));
    dVar3 = a2 - da;
    for (local_64 = 0; a2 = a2 - dVar3 / (double)(iVar2 + 1), local_64 < iVar2;
        local_64 = local_64 + 1) {
      dVar4 = cos(a2);
      dVar1 = this->m_width;
      dVar5 = sin(a2);
      add_vertex(this,vc,dVar4 * dVar1 + x,dVar5 * this->m_width + y);
    }
  }
  else {
    if (da < a2) {
      da = da + 6.283185307179586;
    }
    iVar2 = (int)((da - a2) / (dVar3 * 2.0));
    dVar3 = da - a2;
    for (local_64 = 0; a2 = dVar3 / (double)(iVar2 + 1) + a2, local_64 < iVar2;
        local_64 = local_64 + 1) {
      dVar4 = cos(a2);
      dVar1 = this->m_width;
      dVar5 = sin(a2);
      add_vertex(this,vc,dVar4 * dVar1 + x,dVar5 * this->m_width + y);
    }
  }
  add_vertex(this,vc,x + dx2,y + dy2);
  return;
}

Assistant:

void math_stroke<VC>::calc_arc(VC& vc,
                                   double x,   double y, 
                                   double dx1, double dy1, 
                                   double dx2, double dy2)
    {
        double a1 = atan2(dy1 * m_width_sign, dx1 * m_width_sign);
        double a2 = atan2(dy2 * m_width_sign, dx2 * m_width_sign);
        double da = a1 - a2;
        int i, n;

        da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;

        add_vertex(vc, x + dx1, y + dy1);
        if(m_width_sign > 0)
        {
            if(a1 > a2) a2 += 2 * pi;
            n = int((a2 - a1) / da);
            da = (a2 - a1) / (n + 1);
            a1 += da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 += da;
            }
        }
        else
        {
            if(a1 < a2) a2 -= 2 * pi;
            n = int((a1 - a2) / da);
            da = (a1 - a2) / (n + 1);
            a1 -= da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 -= da;
            }
        }
        add_vertex(vc, x + dx2, y + dy2);
    }